

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O3

int __thiscall
deqp::gles31::Functional::anon_unknown_1::PatchVertexCountCase::init
          (PatchVertexCountCase *this,EVP_PKEY_CTX *ctx)

{
  deInt32 *pdVar1;
  size_type *psVar2;
  pointer pbVar3;
  Context *pCVar4;
  RenderContext *renderCtx;
  SharedPtrStateBase *pSVar5;
  RenderTarget *pRVar6;
  long *plVar7;
  ShaderProgram *this_00;
  SharedPtrStateBase *pSVar8;
  long *extraout_RAX;
  TestError *this_01;
  undefined1 usePointMode;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  size_type *psVar10;
  size_type *psVar11;
  pointer pbVar12;
  ContextInfo *pCVar13;
  Context *code;
  TessPrimitiveType extraout_EDX;
  TessPrimitiveType extraout_EDX_00;
  TessPrimitiveType extraout_EDX_01;
  TessPrimitiveType extraout_EDX_02;
  TessPrimitiveType primType;
  long extraout_RDX;
  deInt32 *pdVar14;
  long lVar15;
  string tessellationEvaluationTemplate;
  string tessellationControlTemplate;
  string outSizeStr;
  string fragmentShaderTemplate;
  string vertexShaderTemplate;
  string inSizeStr;
  size_type *local_388;
  value_type local_380;
  size_type *local_360;
  value_type local_358;
  undefined1 local_338 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_328;
  Context *local_310;
  long local_308;
  Context local_300;
  long local_2e8;
  undefined1 local_2e0 [20];
  undefined4 uStack_2cc;
  value_type local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  Context *local_288 [2];
  undefined1 local_278 [16];
  ContextInfo *local_268;
  undefined1 local_258 [24];
  pointer local_240;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238;
  string local_228;
  string local_208;
  string local_1e8;
  long *local_1c8;
  long local_1b8 [2];
  undefined1 local_1a8 [24];
  pointer pbStack_190;
  ios_base local_138 [32];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_118;
  undefined1 local_f8 [200];
  
  checkTessellationSupport((this->super_TestCase).m_context);
  pRVar6 = Context::getRenderTarget((this->super_TestCase).m_context);
  checkRenderTargetSize
            ((Functional *)(ulong)(uint)pRVar6->m_width,
             (RenderTarget *)(ulong)(uint)pRVar6->m_height,0x100);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::ostream::operator<<((ostringstream *)local_1a8,this->m_inputPatchSize);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::ostream::operator<<(local_1a8,this->m_outputPatchSize);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  local_268 = (ContextInfo *)local_258;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_268,
             "${GLSL_VERSION_DECL}\n\nin highp float in_v_attr;\n\nout highp float in_tc_attr;\n\nvoid main (void)\n{\n\tin_tc_attr = in_v_attr;\n}\n"
             ,"");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_2e0 + 0x10),
                 "${GLSL_VERSION_DECL}\n${TESSELLATION_SHADER_REQUIRE}\n\nlayout (vertices = ",
                 &local_2a8);
  plVar7 = (long *)std::__cxx11::string::append(local_2e0 + 0x10);
  paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 == paVar9) {
    local_328._M_allocated_capacity = paVar9->_M_allocated_capacity;
    local_328._8_8_ = plVar7[3];
    local_338._0_8_ = &local_328;
  }
  else {
    local_328._M_allocated_capacity = paVar9->_M_allocated_capacity;
    local_338._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)*plVar7;
  }
  local_338._8_8_ = plVar7[1];
  *plVar7 = (long)paVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::_M_append(local_338,(ulong)local_1c8);
  psVar2 = &local_380._M_string_length;
  psVar10 = (size_type *)(plVar7 + 2);
  if ((size_type *)*plVar7 == psVar10) {
    local_380._M_string_length = *psVar10;
    local_380.field_2._M_allocated_capacity = plVar7[3];
    local_388 = psVar2;
  }
  else {
    local_380._M_string_length = *psVar10;
    local_388 = (size_type *)*plVar7;
  }
  local_380._M_dataplus._M_p = (pointer)plVar7[1];
  *plVar7 = (long)psVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_388);
  psVar10 = &local_358._M_string_length;
  psVar11 = (size_type *)(plVar7 + 2);
  if ((size_type *)*plVar7 == psVar11) {
    local_358._M_string_length = *psVar11;
    local_358.field_2._M_allocated_capacity = plVar7[3];
    local_360 = psVar10;
  }
  else {
    local_358._M_string_length = *psVar11;
    local_360 = (size_type *)*plVar7;
  }
  local_358._M_dataplus._M_p = (pointer)plVar7[1];
  *plVar7 = (long)psVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_360,(ulong)local_2a8._M_dataplus._M_p);
  pbVar3 = (pointer)(local_1a8 + 0x10);
  pbVar12 = (pointer)(plVar7 + 2);
  if ((pointer)*plVar7 == pbVar12) {
    local_1a8._16_8_ = (pbVar12->_M_dataplus)._M_p;
    pbStack_190 = (pointer)plVar7[3];
    local_1a8._0_8_ = pbVar3;
  }
  else {
    local_1a8._16_8_ = (pbVar12->_M_dataplus)._M_p;
    local_1a8._0_8_ = (pointer)*plVar7;
  }
  local_1a8._8_8_ = plVar7[1];
  *plVar7 = (long)pbVar12;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append(local_1a8);
  local_300.m_contextInfo = (ContextInfo *)local_2e0;
  pCVar13 = (ContextInfo *)(plVar7 + 2);
  if ((ContextInfo *)*plVar7 == pCVar13) {
    local_2e0._0_8_ = pCVar13->_vptr_ContextInfo;
    local_2e0._8_8_ = plVar7[3];
  }
  else {
    local_2e0._0_8_ = pCVar13->_vptr_ContextInfo;
    local_300.m_contextInfo = (ContextInfo *)*plVar7;
  }
  lVar15 = plVar7[1];
  *plVar7 = (long)pCVar13;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_2e8 = lVar15;
  if ((pointer)local_1a8._0_8_ != pbVar3) {
    operator_delete((void *)local_1a8._0_8_,
                    (ulong)((long)&((_Alloc_hider *)local_1a8._16_8_)->_M_p + 1));
    lVar15 = extraout_RDX;
  }
  usePointMode = SUB81(pCVar13,0);
  primType = (TessPrimitiveType)lVar15;
  if (local_360 != psVar10) {
    operator_delete(local_360,local_358._M_string_length + 1);
    primType = extraout_EDX;
  }
  if (local_388 != psVar2) {
    operator_delete(local_388,local_380._M_string_length + 1);
    primType = extraout_EDX_00;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_338._0_8_ != &local_328) {
    operator_delete((void *)local_338._0_8_,local_328._M_allocated_capacity + 1);
    primType = extraout_EDX_01;
  }
  if ((size_type *)CONCAT44(uStack_2cc,local_2e0._16_4_) != &local_2c8._M_string_length) {
    operator_delete((undefined1 *)CONCAT44(uStack_2cc,local_2e0._16_4_),
                    (ulong)((long)&((_Alloc_hider *)local_2c8._M_string_length)->_M_p + 1));
    primType = extraout_EDX_02;
  }
  (anonymous_namespace)::getTessellationEvaluationInLayoutString_abi_cxx11_
            ((string *)local_338,(_anonymous_namespace_ *)&DAT_00000001,primType,(bool)usePointMode)
  ;
  plVar7 = (long *)std::__cxx11::string::replace((ulong)local_338,0,(char *)0x0,0x9521e9);
  psVar11 = (size_type *)(plVar7 + 2);
  if ((size_type *)*plVar7 == psVar11) {
    local_380._M_string_length = *psVar11;
    local_380.field_2._M_allocated_capacity = plVar7[3];
    local_388 = psVar2;
  }
  else {
    local_380._M_string_length = *psVar11;
    local_388 = (size_type *)*plVar7;
  }
  local_380._M_dataplus._M_p = (pointer)plVar7[1];
  *plVar7 = (long)psVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_388);
  psVar11 = (size_type *)(plVar7 + 2);
  if ((size_type *)*plVar7 == psVar11) {
    local_358._M_string_length = *psVar11;
    local_358.field_2._M_allocated_capacity = plVar7[3];
    local_360 = psVar10;
  }
  else {
    local_358._M_string_length = *psVar11;
    local_360 = (size_type *)*plVar7;
  }
  local_358._M_dataplus._M_p = (pointer)plVar7[1];
  *plVar7 = (long)psVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_360,(ulong)local_2a8._M_dataplus._M_p);
  pbVar12 = (pointer)(plVar7 + 2);
  if ((pointer)*plVar7 == pbVar12) {
    local_1a8._16_8_ = (pbVar12->_M_dataplus)._M_p;
    pbStack_190 = (pointer)plVar7[3];
    local_1a8._0_8_ = pbVar3;
  }
  else {
    local_1a8._16_8_ = (pbVar12->_M_dataplus)._M_p;
    local_1a8._0_8_ = (pointer)*plVar7;
  }
  local_1a8._8_8_ = plVar7[1];
  *plVar7 = (long)pbVar12;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append(local_1a8);
  local_310 = &local_300;
  code = (Context *)(plVar7 + 2);
  if ((Context *)*plVar7 == code) {
    local_300.m_testCtx = code->m_testCtx;
    local_300.m_renderCtx = (RenderContext *)plVar7[3];
  }
  else {
    local_300.m_testCtx = code->m_testCtx;
    local_310 = (Context *)*plVar7;
  }
  local_308 = plVar7[1];
  *plVar7 = (long)code;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  if ((pointer)local_1a8._0_8_ != pbVar3) {
    operator_delete((void *)local_1a8._0_8_,
                    (ulong)((long)&((_Alloc_hider *)local_1a8._16_8_)->_M_p + 1));
  }
  if (local_360 != psVar10) {
    operator_delete(local_360,local_358._M_string_length + 1);
  }
  if (local_388 != psVar2) {
    operator_delete(local_388,local_380._M_string_length + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_338._0_8_ != &local_328) {
    operator_delete((void *)local_338._0_8_,local_328._M_allocated_capacity + 1);
  }
  local_288[0] = (Context *)local_278;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_288,
             "${GLSL_VERSION_DECL}\n\nlayout (location = 0) out mediump vec4 o_color;\n\nin mediump vec4 in_f_color;\n\nvoid main (void)\n{\n\to_color = in_f_color;\n}\n"
             ,"");
  this_00 = (ShaderProgram *)operator_new(0xd0);
  pCVar4 = (this->super_TestCase).m_context;
  renderCtx = pCVar4->m_renderCtx;
  memset(local_1a8,0,0xac);
  local_f8._0_8_ = (pointer)0x0;
  local_f8[8] = 0;
  local_f8._9_7_ = 0;
  local_f8[0x10] = 0;
  local_f8._17_8_ = 0;
  (anonymous_namespace)::specializeShader_abi_cxx11_
            ((string *)(local_258 + 0x10),(_anonymous_namespace_ *)pCVar4->m_renderCtx,
             (Context *)local_268,(char *)code);
  local_360 = (size_type *)((ulong)local_360 & 0xffffffff00000000);
  local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_358,local_258._16_8_,
             (char *)(local_258._16_8_ + (long)&local_240->_M_dataplus));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1a8 + ((ulong)local_360 & 0xffffffff) * 0x18),&local_358);
  (anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_1e8,(_anonymous_namespace_ *)((this->super_TestCase).m_context)->m_renderCtx,
             (Context *)local_300.m_contextInfo,(char *)code);
  local_388 = (size_type *)CONCAT44(local_388._4_4_,3);
  local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_380,local_1e8._M_dataplus._M_p,
             local_1e8._M_dataplus._M_p + local_1e8._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1a8 + ((ulong)local_388 & 0xffffffff) * 0x18),&local_380);
  (anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_208,(_anonymous_namespace_ *)((this->super_TestCase).m_context)->m_renderCtx,
             local_310,(char *)code);
  local_338._0_4_ = 4;
  local_338._8_8_ = local_328._M_local_buf + 8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_338 + 8),local_208._M_dataplus._M_p,
             local_208._M_dataplus._M_p + local_208._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1a8 + (local_338._0_8_ & 0xffffffff) * 0x18),(value_type *)(local_338 + 8));
  (anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_228,(_anonymous_namespace_ *)((this->super_TestCase).m_context)->m_renderCtx,
             local_288[0],(char *)code);
  local_2e0._16_4_ = 1;
  local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2c8,local_228._M_dataplus._M_p,
             local_228._M_dataplus._M_p + local_228._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1a8 + (ulong)(uint)local_2e0._16_4_ * 0x18),&local_2c8);
  glu::ShaderProgram::ShaderProgram(this_00,renderCtx,(ProgramSources *)local_1a8);
  pSVar8 = (SharedPtrStateBase *)operator_new(0x20);
  pdVar1 = &pSVar8->strongRefCount;
  pSVar8->strongRefCount = 0;
  pSVar8->weakRefCount = 0;
  pSVar8->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b2a1a8;
  pSVar8[1]._vptr_SharedPtrStateBase = (_func_int **)this_00;
  pSVar8->strongRefCount = 1;
  pSVar8->weakRefCount = 1;
  pSVar5 = (this->m_program).m_state;
  if (pSVar5 != pSVar8) {
    if (pSVar5 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar14 = &pSVar5->strongRefCount;
      *pdVar14 = *pdVar14 + -1;
      UNLOCK();
      if (*pdVar14 == 0) {
        (this->m_program).m_ptr = (ShaderProgram *)0x0;
        (*((this->m_program).m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar14 = &((this->m_program).m_state)->weakRefCount;
      *pdVar14 = *pdVar14 + -1;
      UNLOCK();
      if (*pdVar14 == 0) {
        pSVar5 = (this->m_program).m_state;
        if (pSVar5 != (SharedPtrStateBase *)0x0) {
          (*pSVar5->_vptr_SharedPtrStateBase[1])();
        }
        (this->m_program).m_state = (SharedPtrStateBase *)0x0;
      }
    }
    (this->m_program).m_ptr = this_00;
    (this->m_program).m_state = pSVar8;
    LOCK();
    pSVar8->strongRefCount = pSVar8->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar14 = &((this->m_program).m_state)->weakRefCount;
    *pdVar14 = *pdVar14 + 1;
    UNLOCK();
  }
  pdVar14 = &pSVar8->weakRefCount;
  LOCK();
  *pdVar1 = *pdVar1 + -1;
  UNLOCK();
  if (*pdVar1 == 0) {
    (*pSVar8->_vptr_SharedPtrStateBase[2])(pSVar8);
  }
  LOCK();
  *pdVar14 = *pdVar14 + -1;
  UNLOCK();
  if (*pdVar14 == 0) {
    (*pSVar8->_vptr_SharedPtrStateBase[1])(pSVar8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
    operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
  }
  if ((char *)local_338._8_8_ != local_328._M_local_buf + 8) {
    operator_delete((void *)local_338._8_8_,local_328._8_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_380._M_dataplus._M_p != &local_380.field_2) {
    operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_358._M_dataplus._M_p != &local_358.field_2) {
    operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._16_8_ != &local_238) {
    operator_delete((void *)local_258._16_8_,local_238._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_f8);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_118);
  lVar15 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1a8 + lVar15));
    lVar15 = lVar15 + -0x18;
  } while (lVar15 != -0x18);
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                  (this->m_program).m_ptr);
  if ((((this->m_program).m_ptr)->m_program).m_info.linkOk != false) {
    if (local_288[0] != (Context *)local_278) {
      operator_delete(local_288[0],(ulong)((long)(Platform **)local_278._0_8_ + 1));
    }
    if (local_310 != &local_300) {
      operator_delete(local_310,(ulong)((long)&(local_300.m_testCtx)->m_platform + 1));
    }
    if (local_300.m_contextInfo != (ContextInfo *)local_2e0) {
      operator_delete(local_300.m_contextInfo,(ulong)((long)(Platform **)local_2e0._0_8_ + 1));
    }
    if (local_268 != (ContextInfo *)local_258) {
      operator_delete(local_268,(ulong)((long)(Platform **)local_258._0_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
      operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
    }
    plVar7 = local_1b8;
    if (local_1c8 != plVar7) {
      operator_delete(local_1c8,local_1b8[0] + 1);
      plVar7 = extraout_RAX;
    }
    return (int)plVar7;
  }
  this_01 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_01,"Program compilation failed",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationTests.cpp"
             ,0xbb2);
  __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void PatchVertexCountCase::init (void)
{
	checkTessellationSupport(m_context);
	checkRenderTargetSize(m_context.getRenderTarget(), RENDER_SIZE);

	const string inSizeStr		= de::toString(m_inputPatchSize);
	const string outSizeStr		= de::toString(m_outputPatchSize);

	std::string vertexShaderTemplate			("${GLSL_VERSION_DECL}\n"
													 "\n"
													 "in highp float in_v_attr;\n"
													 "\n"
													 "out highp float in_tc_attr;\n"
													 "\n"
													 "void main (void)\n"
													 "{\n"
													 "	in_tc_attr = in_v_attr;\n"
												 "}\n");
	std::string tessellationControlTemplate		("${GLSL_VERSION_DECL}\n"
												 "${TESSELLATION_SHADER_REQUIRE}\n"
													 "\n"
													 "layout (vertices = " + outSizeStr + ") out;\n"
													 "\n"
													 "in highp float in_tc_attr[];\n"
													 "\n"
													 "out highp float in_te_attr[];\n"
													 "\n"
													 "void main (void)\n"
													 "{\n"
													 "	in_te_attr[gl_InvocationID] = in_tc_attr[gl_InvocationID*" + inSizeStr + "/" + outSizeStr + "];\n"
													 "\n"
													 "	gl_TessLevelInner[0] = 5.0;\n"
													 "	gl_TessLevelInner[1] = 5.0;\n"
													 "\n"
													"	gl_TessLevelOuter[0] = 5.0;\n"
													"	gl_TessLevelOuter[1] = 5.0;\n"
													"	gl_TessLevelOuter[2] = 5.0;\n"
													"	gl_TessLevelOuter[3] = 5.0;\n"
												 "}\n");
	std::string tessellationEvaluationTemplate	("${GLSL_VERSION_DECL}\n"
												 "${TESSELLATION_SHADER_REQUIRE}\n"
													 "\n"
													 + getTessellationEvaluationInLayoutString(TESSPRIMITIVETYPE_QUADS) +
													 "\n"
													 "in highp float in_te_attr[];\n"
													 "\n"
													 "out mediump vec4 in_f_color;\n"
													 "\n"
													 "void main (void)\n"
													 "{\n"
													 "	highp float x = gl_TessCoord.x*2.0 - 1.0;\n"
													 "	highp float y = gl_TessCoord.y - in_te_attr[int(round(gl_TessCoord.x*float(" + outSizeStr + "-1)))];\n"
													 "	gl_Position = vec4(x, y, 0.0, 1.0);\n"
													 "	in_f_color = vec4(1.0);\n"
												 "}\n");
	std::string fragmentShaderTemplate			("${GLSL_VERSION_DECL}\n"
													 "\n"
													 "layout (location = 0) out mediump vec4 o_color;\n"
													 "\n"
													 "in mediump vec4 in_f_color;\n"
													 "\n"
													 "void main (void)\n"
													 "{\n"
													 "	o_color = in_f_color;\n"
												 "}\n");

	m_program = SharedPtr<const ShaderProgram>(new ShaderProgram(m_context.getRenderContext(), glu::ProgramSources()
			<< glu::VertexSource					(specializeShader(m_context, vertexShaderTemplate.c_str()))
			<< glu::TessellationControlSource		(specializeShader(m_context, tessellationControlTemplate.c_str()))
			<< glu::TessellationEvaluationSource	(specializeShader(m_context, tessellationEvaluationTemplate.c_str()))
			<< glu::FragmentSource					(specializeShader(m_context, fragmentShaderTemplate.c_str()))));

	m_testCtx.getLog() << *m_program;
	if (!m_program->isOk())
		TCU_FAIL("Program compilation failed");
}